

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::MemberSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::MemberSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *this_00;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::MemberSyntax> *)allocate(this,0x30,8);
  slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::SeparatedSyntaxList(this_00,args)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }